

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubVerify.cpp
# Opt level: O0

void SubVerifyBase<unsigned_int,int>(char *types)

{
  bool bVar1;
  char *pcVar2;
  TestCase<unsigned_int,_int,_4> TVar3;
  string msg_2;
  uint x;
  string msg_1;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  string msg;
  uint ret;
  TestCase<unsigned_int,_int,_4> test;
  TestVector<unsigned_int,_int,_4> tests;
  undefined4 in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_fffffffffffffda0;
  allocator *in_stack_fffffffffffffda8;
  TestVector<unsigned_int,_int,_4> *in_stack_fffffffffffffdb0;
  allocator local_1e9;
  string local_1e8 [15];
  undefined1 in_stack_fffffffffffffe27;
  int in_stack_fffffffffffffe28;
  uint in_stack_fffffffffffffe2c;
  string *in_stack_fffffffffffffe30;
  undefined1 local_1c1 [33];
  string local_1a0 [32];
  string local_180 [36];
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_15c;
  uint local_158;
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_c8;
  byte local_c2;
  allocator local_c1;
  string local_c0 [55];
  allocator local_89;
  string local_88 [32];
  string local_68 [40];
  undefined8 local_40;
  undefined1 local_38;
  undefined8 local_2c;
  byte local_24;
  TestVector<unsigned_int,_int,_4> local_20;
  
  TestVector<unsigned_int,_int,_4>::TestVector(&local_20);
  TVar3 = TestVector<unsigned_int,_int,_4>::GetNext(in_stack_fffffffffffffdb0);
  local_40 = TVar3._0_8_;
  local_38 = TVar3.fExpected;
  local_2c = local_40;
  local_24 = local_38;
  while( true ) {
    bVar1 = TestVector<unsigned_int,_int,_4>::Done(&local_20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = SafeSubtract<unsigned_int,int>
                      ((uint)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                       (int)in_stack_fffffffffffffda0,
                       (uint *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    if (bVar1 != (bool)(local_24 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,"Error in case ",&local_89);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,pcVar2,&local_c1);
      err_msg<unsigned_int,int>
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28,
                 (bool)in_stack_fffffffffffffe27);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      std::__cxx11::string::~string(local_68);
    }
    local_c2 = 1;
    SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_c8,(uint *)&local_2c);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator-=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
    if ((local_c2 & 1) != (local_24 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,"Error in case ",&local_129);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_150,pcVar2,&local_151);
      err_msg<unsigned_int,int>
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28,
                 (bool)in_stack_fffffffffffffe27);
      std::__cxx11::string::~string(local_150);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
      std::__cxx11::string::~string(local_e8);
    }
    local_c2 = 1;
    local_158 = (uint)local_2c;
    SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_15c,(int *)((long)&local_2c + 4));
    operator-=((uint *)in_stack_fffffffffffffda8,
               (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               )(int)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
    if ((local_c2 & 1) != (local_24 & 1)) {
      in_stack_fffffffffffffdb0 = (TestVector<unsigned_int,_int,_4> *)local_1c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_1c1 + 1),"Error in case ",(allocator *)in_stack_fffffffffffffdb0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
      std::__cxx11::string::~string(local_1a0);
      std::__cxx11::string::~string((string *)(local_1c1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1c1);
      in_stack_fffffffffffffda0 =
           (SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
            *)std::__cxx11::string::c_str();
      in_stack_fffffffffffffda8 = &local_1e9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1e8,(char *)in_stack_fffffffffffffda0,in_stack_fffffffffffffda8);
      err_msg<unsigned_int,int>
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28,
                 (bool)in_stack_fffffffffffffe27);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
      std::__cxx11::string::~string(local_180);
    }
    TVar3 = TestVector<unsigned_int,_int,_4>::GetNext(in_stack_fffffffffffffdb0);
    local_2c = TVar3._0_8_;
    local_24 = TVar3.fExpected;
  }
  return;
}

Assistant:

void SubVerifyBase(const char* types)
{
    TestVector< T, U, OpType::Sub > tests;
    TestCase< T, U, OpType::Sub > test = tests.GetNext();

    while (!tests.Done())
    {
        T ret;
        if (SafeSubtract(test.x, test.y, ret) != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types;
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        // Now test throwing version
        bool fSuccess = true;
        try
        {
            SafeInt<T> si(test.x);
            si -= test.y;
        }
        catch (...)
        {
            fSuccess = false;
        }

        if (fSuccess != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types + " throw (1): ";
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        // Also need to test the version that assigns back out
        // to a plain int, as it has different logic
        fSuccess = true;
        try
        {
            T x(test.x);
            x -= SafeInt<U>(test.y);
        }
        catch (...)
        {
            fSuccess = false;
        }

        if (fSuccess != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types + " throw (2): ";
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        test = tests.GetNext();
    }
}